

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

ostream * soplex::operator<<(ostream *os,
                            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *v)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  uint *puVar8;
  ulong uVar9;
  byte bVar10;
  type t;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar10 = 0;
  if (0 < v->memused) {
    bVar3 = true;
    lVar6 = 0;
    uVar9 = 1;
    do {
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)
               ((long)(v->m_elem->val).m_backend.data._M_elems + lVar6);
      if (!bVar3) {
        if (*(int *)((long)(&(v->m_elem->val).m_backend.data + 1) + lVar6 + 8) != 2) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_b0,0,(type *)0x0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (pcVar7,&local_b0);
          if (iVar4 < 0) {
            std::__ostream_insert<char,std::char_traits<char>>(os," - ",3);
            pNVar1 = v->m_elem;
            puVar8 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar6);
            pcVar7 = &local_b0;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar7->data)._M_elems[0] = *puVar8;
              puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
              pcVar7 = (cpp_dec_float<200U,_int,_void> *)
                       ((long)pcVar7 + ((ulong)bVar10 * -2 + 1) * 4);
            }
            local_b0.exp = *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6);
            local_b0.neg = *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6 + 4);
            local_b0._120_8_ =
                 *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar6 + 8);
            if (local_b0.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
              local_b0.neg = (bool)(local_b0.neg ^ 1);
            }
            pcVar7 = &local_b0;
            goto LAB_0052e76d;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," + ",3);
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)
                 ((long)(v->m_elem->val).m_backend.data._M_elems + lVar6);
      }
LAB_0052e76d:
      boost::multiprecision::operator<<
                (os,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(os," x",2);
      std::ostream::operator<<((ostream *)os,*(int *)((long)(&v->m_elem->val + 1) + lVar6));
      if ((uVar9 & 3) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n\t",2);
      }
      lVar6 = lVar6 + 0x84;
      bVar3 = false;
      bVar2 = (long)uVar9 < (long)v->memused;
      uVar9 = uVar9 + 1;
    } while (bVar2);
  }
  return os;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}